

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O2

void __thiscall
wasm::ReFinalize::replaceUntaken(ReFinalize *this,Expression *value,Expression *condition)

{
  ulong in_RCX;
  optional<wasm::Type> type;
  Builder local_20;
  Builder builder;
  
  if ((value->type).id != 1) {
    __assert_fail("value->type == Type::unreachable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ReFinalize.cpp"
                  ,0xde,"void wasm::ReFinalize::replaceUntaken(Expression *, Expression *)");
  }
  if (condition != (Expression *)0x0) {
    local_20.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
         ).super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
         super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currModule
    ;
    if (1 < (condition->type).id) {
      condition = (Expression *)Builder::makeDrop(&local_20,condition);
    }
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
    value = (Expression *)Builder::makeSequence(&local_20,value,condition,type);
    if (6 < (((Block *)value)->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
            type.id) {
      __assert_fail("replacement->type.isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ReFinalize.cpp"
                    ,0xef,"void wasm::ReFinalize::replaceUntaken(Expression *, Expression *)");
    }
  }
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
              ).super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
              .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
             value);
  return;
}

Assistant:

void ReFinalize::replaceUntaken(Expression* value, Expression* condition) {
  assert(value->type == Type::unreachable);
  auto* replacement = value;
  if (condition) {
    Builder builder(*getModule());
    // Even if we have
    //  (block
    //   (unreachable)
    //   (i32.const 1)
    //  )
    // we want the block type to be unreachable. That is valid as
    // the value is unreachable, and necessary since the type of
    // the condition did not have an impact before (the break/switch
    // type was unreachable), and might not fit in.
    if (condition->type.isConcrete()) {
      condition = builder.makeDrop(condition);
    }
    replacement = builder.makeSequence(value, condition);
    assert(replacement->type.isBasic() && "Basic type expected");
  }
  replaceCurrent(replacement);
}